

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

DiagnosticStream * __thiscall
anon_unknown.dwarf_69d930::Parser::diagnostic
          (DiagnosticStream *__return_storage_ptr__,Parser *this,spv_result_t error)

{
  spv_position_t position;
  DiagnosticStream *extraout_RAX;
  DiagnosticStream *extraout_RAX_00;
  DiagnosticStream *pDVar1;
  spv_result_t in_ECX;
  undefined4 in_register_00000014;
  string local_48;
  
  position.index._4_4_ = in_register_00000014;
  position.index._0_4_ = error;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  position.line = 0;
  position.column = 0;
  spvtools::DiagnosticStream::DiagnosticStream
            (__return_storage_ptr__,position,(MessageConsumer *)this,&local_48,in_ECX);
  pDVar1 = extraout_RAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    pDVar1 = extraout_RAX_00;
  }
  return pDVar1;
}

Assistant:

spvtools::DiagnosticStream diagnostic(spv_result_t error) {
    return spvtools::DiagnosticStream({0, 0, _.instruction_count}, consumer_,
                                      "", error);
  }